

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::egl::anon_unknown_1::QueryRobustAccessCase::iterate(QueryRobustAccessCase *this)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  GLenum err;
  char *description;
  bool bVar3;
  deUint8 robustAccessGL;
  RenderingContext context;
  EGLint attribList [7];
  Functions gl;
  GLboolean local_1c1a;
  GLboolean local_1c19;
  RenderingContext local_1c18;
  EGLint local_1be8 [8];
  undefined1 local_1bc8 [120];
  ios_base local_1b50 [264];
  undefined1 local_1a48 [120];
  ios_base local_19d0 [1824];
  glGetBooleanvFunc local_12b0;
  glGetErrorFunc local_1248;
  
  pTVar2 = ((this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
           ->m_log;
  poVar1 = (ostringstream *)(local_1a48 + 8);
  local_1a48._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,
             "Check that after successfully creating a robust context the robust access query returned by glBooleanv() equals GL_TRUE\n\n"
             ,0x79);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a48,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_19d0);
  local_1be8[4] = 0x30bf;
  local_1be8[5] = 1;
  local_1be8[6] = 0x3038;
  local_1be8[0] = 0x3098;
  local_1be8[1] = 3;
  local_1be8[2] = 0x30fb;
  local_1be8[3] = 1;
  RobustnessTestCase::checkRequiredEGLExtensions(&this->super_RobustnessTestCase,local_1be8);
  local_1a48._0_8_ = (TestLog *)0x0;
  RenderingContext::RenderingContext
            (&local_1c18,(this->super_RobustnessTestCase).super_TestCase.m_eglTestCtx,local_1be8,
             &(this->super_RobustnessTestCase).m_eglConfig,
             &(this->super_RobustnessTestCase).m_eglDisplay,(EGLContext *)local_1a48);
  RenderingContext::makeCurrent
            (&local_1c18,(EGLSurface *)(this->super_RobustnessTestCase).m_eglSurface);
  glw::Functions::Functions((Functions *)local_1a48);
  RenderingContext::initGLFunctions
            ((RenderingContext *)local_1c18.m_eglTestCtx,(Functions *)local_1c18.m_attribList);
  checkRequiredGLRobustnessExtension(local_1be8,(Functions *)local_1a48);
  (*local_12b0)(0x90f3,&local_1c1a);
  err = (*local_1248)();
  glu::checkError(err,"glGetBooleanv()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                  ,0x58a);
  bVar3 = local_1c1a != '\x01';
  if (bVar3) {
    poVar1 = (ostringstream *)(local_1bc8 + 8);
    local_1bc8._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Invalid GL_CONTEXT_ROBUST_ACCESS returned by glGetBooleanv(). Got \'",0x43);
    local_1c19 = local_1c1a;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)&local_1c19,1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"\' expected GL_TRUE.",0x13);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1bc8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_1b50);
    description = "Fail";
  }
  else {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
             ,(uint)bVar3,description);
  RenderingContext::~RenderingContext(&local_1c18);
  return STOP;
}

Assistant:

TestCase::IterateResult	iterate		(void)
	{
		TestLog&	log		= m_testCtx.getLog();

		log << tcu::TestLog::Message
			<< "Check that after successfully creating a robust context the robust access query returned by glBooleanv() equals GL_TRUE\n\n"
			<< tcu::TestLog::EndMessage;

		const EGLint attribList[] =
		{
			EGL_CONTEXT_CLIENT_VERSION, 3,
			EGL_CONTEXT_MINOR_VERSION_KHR, 1,
			EGL_CONTEXT_OPENGL_ROBUST_ACCESS_EXT, EGL_TRUE,
			EGL_NONE
		};

		checkRequiredEGLExtensions(attribList);

		RenderingContext context(m_eglTestCtx, attribList, m_eglConfig, m_eglDisplay, EGL_NO_CONTEXT);
		context.makeCurrent(m_eglSurface);

		glw::Functions gl;
		context.initGLFunctions(&gl);
		checkRequiredGLRobustnessExtension(attribList, gl);

		deUint8 robustAccessGL;
		gl.getBooleanv(GL_CONTEXT_ROBUST_ACCESS_EXT, &robustAccessGL);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetBooleanv()");

		if (robustAccessGL != GL_TRUE)
		{
			log << TestLog::Message
				<< "Invalid GL_CONTEXT_ROBUST_ACCESS returned by glGetBooleanv(). Got '" << robustAccessGL << "' expected GL_TRUE."
				<< TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
			return STOP;
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}